

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

void XorRegion(QRegionPrivate *sra,QRegionPrivate *srb,QRegionPrivate *dest)

{
  int iVar1;
  Representation *pRVar2;
  QRect *pQVar3;
  Representation *pRVar4;
  long lVar5;
  long lVar6;
  QRegionPrivate *r;
  Representation *pRVar7;
  Representation *pRVar8;
  QRect *pQVar9;
  long in_FS_OFFSET;
  Representation RVar10;
  Representation RVar11;
  Representation RVar12;
  Representation RVar13;
  Representation RVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  QRegionPrivate local_b8;
  QRegionPrivate local_78;
  long local_38;
  
  r = &local_b8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.numRects = 0;
  local_78.innerArea = -1;
  local_78.rects.d.d = (Data *)0x0;
  local_78.rects.d.ptr = (QRect *)0x0;
  local_78.rects.d.size = 0;
  local_78.extents.x1.m_i = 0;
  local_78.extents.y1.m_i = 0;
  local_78.extents.x2.m_i = -1;
  local_78.extents.y2.m_i = -1;
  local_78.innerRect.x1.m_i = 0;
  local_78.innerRect.y1.m_i = 0;
  local_78.innerRect.x2.m_i = -1;
  local_78.innerRect.y2.m_i = -1;
  local_b8.numRects = 0;
  local_b8.innerArea = -1;
  local_b8.rects.d.d = (Data *)0x0;
  local_b8.rects.d.ptr = (QRect *)0x0;
  local_b8.rects.d.size = 0;
  local_b8.extents.x1.m_i = 0;
  local_b8.extents.y1.m_i = 0;
  local_b8.extents.x2.m_i = -1;
  local_b8.extents.y2.m_i = -1;
  local_b8.innerRect.x1.m_i = 0;
  local_b8.innerRect.y1.m_i = 0;
  local_b8.innerRect.x2.m_i = -1;
  local_b8.innerRect.y2.m_i = -1;
  if (((((sra->extents).x1.m_i < (srb->innerRect).x1.m_i) ||
       ((srb->innerRect).x2.m_i < (sra->extents).x2.m_i)) ||
      ((sra->extents).y1.m_i < (srb->innerRect).y1.m_i)) ||
     ((srb->innerRect).y2.m_i < (sra->extents).y2.m_i)) {
    miRegionOp(&local_78,sra,srb,miSubtractO,miSubtractNonO1,(NonOverlapFunc)0x0);
    miSetExtents(&local_78);
  }
  if ((((srb->extents).x1.m_i < (sra->innerRect).x1.m_i) ||
      ((sra->innerRect).x2.m_i < (srb->extents).x2.m_i)) ||
     (((srb->extents).y1.m_i < (sra->innerRect).y1.m_i ||
      ((sra->innerRect).y2.m_i < (srb->extents).y2.m_i)))) {
    miRegionOp(&local_b8,srb,sra,miSubtractO,miSubtractNonO1,(NonOverlapFunc)0x0);
    miSetExtents(&local_b8);
  }
  lVar6 = (long)local_78.numRects;
  if (lVar6 == 0) {
    dest->numRects = local_b8.numRects;
    dest->innerArea = local_b8.innerArea;
    QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_b8.rects.d);
    RVar10.m_i = local_b8.extents.x1.m_i;
    RVar11.m_i = local_b8.extents.y1.m_i;
    RVar12.m_i = local_b8.extents.x2.m_i;
    RVar13.m_i = local_b8.extents.y2.m_i;
    RVar14.m_i = local_b8.innerRect.x1.m_i;
    RVar15.m_i = local_b8.innerRect.y1.m_i;
    RVar16.m_i = local_b8.innerRect.x2.m_i;
    RVar17.m_i = local_b8.innerRect.y2.m_i;
  }
  else {
    lVar5 = (long)local_b8.numRects;
    if (lVar5 != 0) {
      pRVar2 = &local_78.extents.y2;
      pQVar9 = local_b8.rects.d.ptr;
      if (local_b8.numRects == 1) {
        pQVar9 = &local_b8.extents;
      }
      pQVar3 = local_b8.rects.d.ptr;
      if (local_b8.numRects == 1) {
        pQVar3 = &local_b8.extents;
      }
      iVar1 = (pQVar3->y1).m_i;
      pRVar4 = &local_78.rects.d.ptr[lVar6 + -1].y2;
      if (local_78.numRects == 1) {
        pRVar4 = pRVar2;
      }
      if (pRVar4->m_i < iVar1) {
LAB_0042e153:
        dest->numRects = local_78.numRects;
        dest->innerArea = local_78.innerArea;
        QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_78.rects.d);
        (dest->extents).x1 = (Representation)local_78.extents.x1.m_i;
        (dest->extents).y1 = (Representation)local_78.extents.y1.m_i;
        (dest->extents).x2 = (Representation)local_78.extents.x2.m_i;
        (dest->extents).y2 = (Representation)local_78.extents.y2.m_i;
        (dest->innerRect).x1 = (Representation)local_78.innerRect.x1.m_i;
        (dest->innerRect).y1 = (Representation)local_78.innerRect.y1.m_i;
        (dest->innerRect).x2 = (Representation)local_78.innerRect.x2.m_i;
        (dest->innerRect).y2 = (Representation)local_78.innerRect.y2.m_i;
      }
      else {
        pRVar7 = &local_b8.extents.y2;
        pQVar3 = local_78.rects.d.ptr + lVar6 + -1;
        if (local_78.numRects == 1) {
          pQVar3 = &local_78.extents;
        }
        if (iVar1 == (pQVar3->y1).m_i) {
          pRVar8 = &(local_b8.rects.d.ptr)->y2;
          if (local_b8.numRects == 1) {
            pRVar8 = pRVar7;
          }
          if (pRVar8->m_i == pRVar4->m_i) {
            pQVar3 = local_78.rects.d.ptr + lVar6 + -1;
            if (local_78.numRects == 1) {
              pQVar3 = &local_78.extents;
            }
            if ((pQVar3->x2).m_i < (pQVar9->x1).m_i) goto LAB_0042e153;
          }
        }
        pQVar9 = &local_78.extents;
        if (local_78.numRects != 1) {
          pQVar9 = local_78.rects.d.ptr;
        }
        pQVar3 = local_78.rects.d.ptr;
        if (local_78.numRects == 1) {
          pQVar3 = &local_78.extents;
        }
        iVar1 = (pQVar3->y1).m_i;
        pRVar4 = &local_b8.rects.d.ptr[lVar5 + -1].y2;
        if (local_b8.numRects == 1) {
          pRVar4 = pRVar7;
        }
        if (iVar1 <= pRVar4->m_i) {
          pQVar3 = local_b8.rects.d.ptr + lVar5 + -1;
          if (local_b8.numRects == 1) {
            pQVar3 = &local_b8.extents;
          }
          if (iVar1 == (pQVar3->y1).m_i) {
            pRVar7 = &(local_78.rects.d.ptr)->y2;
            if (local_78.numRects == 1) {
              pRVar7 = pRVar2;
            }
            if (pRVar7->m_i == pRVar4->m_i) {
              pQVar3 = local_b8.rects.d.ptr + lVar5 + -1;
              if (local_b8.numRects == 1) {
                pQVar3 = &local_b8.extents;
              }
              if ((pQVar3->x2).m_i < (pQVar9->x1).m_i) goto LAB_0042e263;
            }
          }
          UnionRegion(&local_78,&local_b8,dest);
          goto LAB_0042e291;
        }
LAB_0042e263:
        dest->numRects = local_b8.numRects;
        dest->innerArea = local_b8.innerArea;
        QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_b8.rects.d);
        (dest->extents).x1 = (Representation)local_b8.extents.x1.m_i;
        (dest->extents).y1 = (Representation)local_b8.extents.y1.m_i;
        (dest->extents).x2 = (Representation)local_b8.extents.x2.m_i;
        (dest->extents).y2 = (Representation)local_b8.extents.y2.m_i;
        (dest->innerRect).x1 = (Representation)local_b8.innerRect.x1.m_i;
        (dest->innerRect).y1 = (Representation)local_b8.innerRect.y1.m_i;
        (dest->innerRect).x2 = (Representation)local_b8.innerRect.x2.m_i;
        (dest->innerRect).y2 = (Representation)local_b8.innerRect.y2.m_i;
        r = &local_78;
      }
      QRegionPrivate::append(dest,r);
      goto LAB_0042e291;
    }
    dest->numRects = local_78.numRects;
    dest->innerArea = local_78.innerArea;
    QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_78.rects.d);
    RVar10.m_i = local_78.extents.x1.m_i;
    RVar11.m_i = local_78.extents.y1.m_i;
    RVar12.m_i = local_78.extents.x2.m_i;
    RVar13.m_i = local_78.extents.y2.m_i;
    RVar14.m_i = local_78.innerRect.x1.m_i;
    RVar15.m_i = local_78.innerRect.y1.m_i;
    RVar16.m_i = local_78.innerRect.x2.m_i;
    RVar17.m_i = local_78.innerRect.y2.m_i;
  }
  (dest->extents).x1.m_i = RVar10.m_i;
  (dest->extents).y1.m_i = RVar11.m_i;
  (dest->extents).x2.m_i = RVar12.m_i;
  (dest->extents).y2.m_i = RVar13.m_i;
  (dest->innerRect).x1.m_i = RVar14.m_i;
  (dest->innerRect).y1.m_i = RVar15.m_i;
  (dest->innerRect).x2.m_i = RVar16.m_i;
  (dest->innerRect).y2.m_i = RVar17.m_i;
LAB_0042e291:
  if (&(local_b8.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.rects.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (&(local_78.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.rects.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void XorRegion(QRegionPrivate *sra, QRegionPrivate *srb, QRegionPrivate &dest)
{
    Q_ASSERT(!isEmptyHelper(sra) && !isEmptyHelper(srb));
    Q_ASSERT(EXTENTCHECK(&sra->extents, &srb->extents));
    Q_ASSERT(!EqualRegion(sra, srb));

    QRegionPrivate tra, trb;

    if (!srb->contains(*sra))
        SubtractRegion(sra, srb, tra);
    if (!sra->contains(*srb))
        SubtractRegion(srb, sra, trb);

    Q_ASSERT(isEmptyHelper(&trb) || !tra.contains(trb));
    Q_ASSERT(isEmptyHelper(&tra) || !trb.contains(tra));

    if (isEmptyHelper(&tra)) {
        dest = trb;
    } else if (isEmptyHelper(&trb)) {
        dest = tra;
    } else if (tra.canAppend(&trb)) {
        dest = tra;
        dest.append(&trb);
    } else if (trb.canAppend(&tra)) {
        dest = trb;
        dest.append(&tra);
    } else {
        UnionRegion(&tra, &trb, dest);
    }
}